

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

DirectionalLight * __thiscall
embree::SceneGraph::DirectionalLight::transform(DirectionalLight *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  DirectionalLight *in_RDI;
  
  fVar1 = (this->D).field_0.m128[0];
  fVar2 = (this->D).field_0.m128[1];
  fVar3 = (this->D).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[0];
  fVar5 = (space->l).vz.field_0.m128[1];
  fVar6 = (space->l).vz.field_0.m128[2];
  fVar7 = (space->l).vz.field_0.m128[3];
  fVar8 = (space->l).vy.field_0.m128[0];
  fVar9 = (space->l).vy.field_0.m128[1];
  fVar10 = (space->l).vy.field_0.m128[2];
  fVar11 = (space->l).vy.field_0.m128[3];
  fVar12 = (space->l).vx.field_0.m128[0];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  (in_RDI->super_Light).type = LIGHT_DIRECTIONAL;
  (in_RDI->D).field_0.m128[0] = fVar1 * fVar12 + fVar2 * fVar8 + fVar3 * fVar4;
  (in_RDI->D).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar9 + fVar3 * fVar5;
  (in_RDI->D).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar10 + fVar3 * fVar6;
  (in_RDI->D).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar11 + fVar3 * fVar7;
  uVar16 = *(undefined8 *)((long)&(this->E).field_0 + 8);
  *(undefined8 *)&(in_RDI->E).field_0 = *(undefined8 *)&(this->E).field_0;
  *(undefined8 *)((long)&(in_RDI->E).field_0 + 8) = uVar16;
  return in_RDI;
}

Assistant:

DirectionalLight transform(const AffineSpace3fa& space) const {
        return DirectionalLight(xfmVector(space,D),E);
      }